

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int wave_add_serial(uint user_gpio,uint baud,uint32_t databits,uint32_t stophalfbits,uint32_t offset
                   ,uint numChar,char *str)

{
  int in_EDX;
  int in_R9D;
  gpioExtent_t ext [2];
  uint8_t buf [12];
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  gpioExtent_t *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_R9D == 0) {
    local_4 = 0;
  }
  else {
    local_4 = pigpio_command_ext(in_R9D,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                                 (int)((ulong)&stack0xffffffffffffffd8 >> 0x20),
                                 (int)&stack0xffffffffffffffd8,0,in_stack_ffffffffffffffd0,in_EDX);
  }
  return local_4;
}

Assistant:

int wave_add_serial(
   unsigned user_gpio, unsigned baud, uint32_t databits,
   uint32_t stophalfbits, uint32_t offset,  unsigned numChar, char *str)
{
   uint8_t buf[12];
   gpioExtent_t ext[2];

   /*
   p1=user_gpio
   p2=baud
   p3=len+12
   ## extension ##
   uint32_t databits
   uint32_t stophalfbits
   uint32_t offset
   char[len] str
   */

   if (!numChar) return 0;

   memcpy(buf, &databits, 4);
   memcpy(buf+4, &stophalfbits, 4);
   memcpy(buf+8, &offset, 4);

   ext[0].size = sizeof(buf);
   ext[0].ptr = buf;

   ext[1].size = numChar;
   ext[1].ptr = str;

   return pigpio_command_ext(gPigCommand, PI_CMD_WVAS,
      user_gpio, baud, numChar+sizeof(buf), 2, ext, 1);
}